

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O2

TidyMessageImpl *
tidyMessageCreateInitV
          (TidyDocImpl *doc,Node *node,uint code,int line,int column,TidyReportLevel level,
          __va_list_tag *args)

{
  printfArg *ppVar1;
  tidyStrings tVar2;
  tidyStrings *ptVar3;
  int iVar4;
  uint uVar5;
  Bool BVar6;
  Bool BVar7;
  TidyMessageImpl *pTVar8;
  byte *pbVar9;
  byte *pbVar10;
  printfArg *ppVar11;
  long lVar12;
  ctmbstr ptVar13;
  tmbstr ptVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  anon_union_8_4_c3534ca5_for_u *paVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  char *pcVar23;
  TidyDoc tdoc;
  char *format;
  va_list args_copy;
  
  pTVar8 = (TidyMessageImpl *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x90);
  pTVar8->tidyDoc = doc;
  pTVar8->tidyNode = node;
  pTVar8->code = code;
  pTVar8->line = line;
  pTVar8->column = column;
  pTVar8->level = level;
  pTVar8->muted = no;
  ptVar3 = (doc->muted).list;
  if (ptVar3 != (tidyStrings *)0x0) {
    uVar16 = 0;
    do {
      tVar2 = ptVar3[uVar16];
      if (tVar2 == 0) goto LAB_00157a42;
      uVar16 = uVar16 + 1;
    } while (tVar2 != code);
    pTVar8->muted = yes;
  }
LAB_00157a42:
  args_copy[0].reg_save_area = args->reg_save_area;
  args_copy[0].gp_offset = args->gp_offset;
  args_copy[0].fp_offset = args->fp_offset;
  args_copy[0].overflow_arg_area = args->overflow_arg_area;
  pbVar9 = (byte *)tidyDefaultString(code);
  pTVar8->argcount = 0;
  uVar16 = 0;
  pbVar10 = pbVar9;
LAB_00157a6c:
  pbVar10 = pbVar10 + 1;
LAB_00157a6f:
  pbVar21 = pbVar10;
  if (pbVar21[-1] != 0) goto code_r0x00157a77;
  if (uVar16 == 0) {
LAB_00157cae:
    ppVar11 = (printfArg *)0x0;
    goto LAB_00157cd4;
  }
  ppVar11 = (printfArg *)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)uVar16 * 0x30);
  if (ppVar11 == (printfArg *)0x0) {
    pTVar8->argcount = -1;
    goto LAB_00157cae;
  }
  for (lVar12 = 0; (ulong)uVar16 * 0x30 - lVar12 != 0; lVar12 = lVar12 + 0x30) {
    pcVar23 = ppVar11->format + lVar12 + -0xc;
    pcVar23[0] = '\x14';
    pcVar23[1] = '\0';
    pcVar23[2] = '\0';
    pcVar23[3] = '\0';
  }
  lVar12 = -1;
  pbVar10 = pbVar9;
  do {
    do {
      while (pbVar21 = pbVar10, *pbVar21 != 0x25) {
        pbVar10 = pbVar21 + 1;
        if (*pbVar21 == 0) {
          if (pTVar8->argcount < 0) goto LAB_00157cb7;
          pTVar8->argcount = uVar16;
          goto LAB_00157cd4;
        }
      }
      pbVar10 = pbVar21 + 2;
      bVar15 = pbVar21[1];
    } while (bVar15 == 0x25);
    if (bVar15 == 0x2a) break;
    iVar4 = ((int)pbVar10 - (int)pbVar9) + -2;
    pbVar21 = pbVar21 + 3;
    while ((byte)(bVar15 - 0x30) < 10) {
      pbVar21 = pbVar21 + 1;
      bVar15 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    }
    if (bVar15 == 0x2e) {
      bVar15 = *pbVar10;
      pbVar10 = pbVar21;
      if (bVar15 == 0x2a) break;
      while ((byte)(bVar15 - 0x30) < 10) {
        bVar15 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      }
    }
    lVar12 = lVar12 + 1;
    ppVar1 = ppVar11 + lVar12;
    ppVar11[lVar12].type = tidyFormatType_UINT;
    switch(bVar15) {
    case 99:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00157b82_caseD_63;
    case 100:
    case 0x69:
      ppVar1->type = tidyFormatType_INT;
      goto switchD_00157b82_caseD_63;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00157b82_caseD_65:
      ppVar1->type = tidyFormatType_DOUBLE;
      uVar22 = (ulong)args_copy[0].fp_offset;
      if (uVar22 < 0xa1) {
        args_copy[0].fp_offset = args_copy[0].fp_offset + 0x10;
        paVar19 = (anon_union_8_4_c3534ca5_for_u *)(uVar22 + (long)args_copy[0].reg_save_area);
      }
      else {
        paVar19 = (anon_union_8_4_c3534ca5_for_u *)args_copy[0].overflow_arg_area;
        args_copy[0].overflow_arg_area = (void *)((long)args_copy[0].overflow_arg_area + 8);
      }
      ppVar1->u = *paVar19;
      break;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_00157b82_caseD_68:
      ppVar1->type = tidyFormatType_UNKNOWN;
      pTVar8->argcount = -1;
      break;
    case 0x73:
      ppVar1->type = tidyFormatType_STRING;
      uVar22 = args_copy[0]._0_8_ & 0xffffffff;
      if (uVar22 < 0x29) {
        args_copy[0].gp_offset = args_copy[0].gp_offset + 8;
        paVar19 = (anon_union_8_4_c3534ca5_for_u *)(uVar22 + (long)args_copy[0].reg_save_area);
      }
      else {
        paVar19 = (anon_union_8_4_c3534ca5_for_u *)args_copy[0].overflow_arg_area;
        args_copy[0].overflow_arg_area = (void *)((long)args_copy[0].overflow_arg_area + 8);
      }
      ppVar1->u = *paVar19;
      break;
    default:
      if (bVar15 - 0x45 < 3) goto switchD_00157b82_caseD_65;
      if (bVar15 != 0x58) goto switchD_00157b82_caseD_68;
switchD_00157b82_caseD_63:
      uVar22 = args_copy[0]._0_8_ & 0xffffffff;
      if (uVar22 < 0x29) {
        args_copy[0].gp_offset = args_copy[0].gp_offset + 8;
        piVar18 = (int *)(uVar22 + (long)args_copy[0].reg_save_area);
      }
      else {
        piVar18 = (int *)args_copy[0].overflow_arg_area;
        args_copy[0].overflow_arg_area = (void *)((long)args_copy[0].overflow_arg_area + 8);
      }
      (ppVar1->u).i = *piVar18;
    }
    ppVar1->formatStart = iVar4;
    iVar17 = (int)pbVar10 - (iVar4 + (int)pbVar9);
    ppVar1->formatLength = iVar17;
    if (0x14 < iVar17) break;
    strncpy(ppVar1->format,(char *)(pbVar9 + iVar4),(long)iVar17);
    ppVar1->format[iVar17] = '\0';
  } while (ppVar1->type != tidyFormatType_UNKNOWN);
  pTVar8->argcount = -1;
LAB_00157cb7:
  (*doc->allocator->vtbl->free)(doc->allocator,ppVar11);
  ppVar11 = (printfArg *)0x0;
LAB_00157cd4:
  pTVar8->arguments = ppVar11;
  ptVar13 = prvTidytidyErrorCodeAsKey(code);
  pTVar8->messageKey = ptVar13;
  ptVar13 = tidyDefaultString(code);
  pTVar8->messageFormatDefault = ptVar13;
  ptVar13 = tidyLocalizedString(code);
  pTVar8->messageFormat = ptVar13;
  ptVar14 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar8->messageDefault = ptVar14;
  args_copy[0].gp_offset = args->gp_offset;
  args_copy[0].fp_offset = args->fp_offset;
  args_copy[0].overflow_arg_area = args->overflow_arg_area;
  args_copy[0].reg_save_area = args->reg_save_area;
  prvTidytmbvsnprintf(pTVar8->messageDefault,0x800,pTVar8->messageFormatDefault,args_copy);
  ptVar14 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar8->message = ptVar14;
  args_copy[0].gp_offset = args->gp_offset;
  args_copy[0].fp_offset = args->fp_offset;
  args_copy[0].overflow_arg_area = args->overflow_arg_area;
  args_copy[0].reg_save_area = args->reg_save_area;
  prvTidytmbvsnprintf(pTVar8->message,0x800,pTVar8->messageFormat,args_copy);
  ptVar14 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar8->messagePosDefault = ptVar14;
  ptVar14 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar8->messagePos = ptVar14;
  if ((*(int *)((doc->config).value + 0x13) == 0) ||
     (uVar20 = (doc->config).value[0x14].v, uVar20 == 0)) {
    if ((*(int *)((doc->config).value + 0x4a) != 0) && ((doc->config).value[0x14].v != 0)) {
      ptVar14 = pTVar8->messagePosDefault;
      ptVar13 = tidyDefaultString(0x1f6);
      prvTidytmbsnprintf(ptVar14,0x800,ptVar13,(doc->config).value[0x14].v,(ulong)(uint)line,
                         (ulong)(uint)column);
      ptVar14 = pTVar8->messagePos;
      pcVar23 = tidyLocalizedString(0x1f6);
      uVar20 = (doc->config).value[0x14].v;
      goto LAB_00157e6e;
    }
    ptVar14 = pTVar8->messagePosDefault;
    ptVar13 = tidyDefaultString(0x1f5);
    prvTidytmbsnprintf(ptVar14,0x800,ptVar13,(ulong)(uint)line,(ulong)(uint)column);
    ptVar14 = pTVar8->messagePos;
    ptVar13 = tidyLocalizedString(0x1f5);
    prvTidytmbsnprintf(ptVar14,0x800,ptVar13,(ulong)(uint)line,(ulong)(uint)column);
  }
  else {
    prvTidytmbsnprintf(pTVar8->messagePosDefault,0x800,"%s:%d:%d: ",uVar20,(ulong)(uint)line,
                       (ulong)(uint)column);
    ptVar14 = pTVar8->messagePos;
    uVar20 = (doc->config).value[0x14].v;
    pcVar23 = "%s:%d:%d: ";
LAB_00157e6e:
    prvTidytmbsnprintf(ptVar14,0x800,pcVar23,uVar20,(ulong)(uint)line,(ulong)(uint)column);
  }
  ptVar13 = tidyDefaultString(level);
  pTVar8->messagePrefixDefault = ptVar13;
  ptVar13 = tidyLocalizedString(level);
  pTVar8->messagePrefix = ptVar13;
  pcVar23 = "%s%s%s";
  if (column < 1) {
    pcVar23 = "%.0s%s%s";
  }
  if (line < 1) {
    pcVar23 = "%.0s%s%s";
  }
  format = "%.0s%.0s%s";
  if (level < TidyDialogueSummary) {
    format = pcVar23;
  }
  ptVar14 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar8->messageOutputDefault = ptVar14;
  prvTidytmbsnprintf(ptVar14,0x800,format,pTVar8->messagePosDefault,pTVar8->messagePrefixDefault,
                     pTVar8->messageDefault);
  ptVar14 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar8->messageOutput = ptVar14;
  prvTidytmbsnprintf(ptVar14,0x800,format,pTVar8->messagePos,pTVar8->messagePrefix,pTVar8->message);
  if ((level < TidyDialogueSummary) && (*(int *)((doc->config).value + 0x37) == 1)) {
    ptVar13 = prvTidytidyErrorCodeAsKey(code);
    uVar5 = prvTidytmbstrlen(pTVar8->messageOutputDefault);
    if (uVar5 < 0x800) {
      prvTidytmbsnprintf(pTVar8->messageOutputDefault + uVar5,(ulong)(0x800 - uVar5)," (%s)",ptVar13
                        );
    }
    uVar5 = prvTidytmbstrlen(pTVar8->messageOutput);
    if (uVar5 < 0x800) {
      prvTidytmbsnprintf(pTVar8->messageOutput + uVar5,(ulong)(0x800 - uVar5)," (%s)",ptVar13);
    }
  }
  pTVar8->allowMessage = yes;
  if (pTVar8->level < TidyDialogueSummary) {
    if (doc->reportFilter != (TidyReportFilter)0x0) {
      BVar6 = (*doc->reportFilter)
                        ((TidyDoc)doc,pTVar8->level,pTVar8->line,pTVar8->column,
                         pTVar8->messageOutput);
      pTVar8->allowMessage = BVar6 & yes;
      if (TidyFatal < pTVar8->level) goto LAB_00158096;
    }
    if (doc->reportCallback != (TidyReportCallback)0x0) {
      args_copy[0].reg_save_area = args->reg_save_area;
      args_copy[0].gp_offset = args->gp_offset;
      args_copy[0].fp_offset = args->fp_offset;
      args_copy[0].overflow_arg_area = args->overflow_arg_area;
      BVar6 = pTVar8->allowMessage;
      BVar7 = (*doc->reportCallback)
                        ((TidyDoc)doc,pTVar8->level,pTVar8->line,pTVar8->column,pTVar8->messageKey,
                         args_copy);
      pTVar8->allowMessage = BVar7 & BVar6;
    }
  }
LAB_00158096:
  if (doc->messageCallback != (TidyMessageCallback)0x0) {
    BVar6 = pTVar8->allowMessage;
    BVar7 = (*doc->messageCallback)((TidyMessage)pTVar8);
    pTVar8->allowMessage = BVar7 & BVar6;
  }
  return pTVar8;
code_r0x00157a77:
  pbVar10 = pbVar21 + 1;
  if (pbVar21[-1] == 0x25) goto code_r0x00157a7f;
  goto LAB_00157a6f;
code_r0x00157a7f:
  uVar16 = uVar16 + (*pbVar21 != 0x25);
  goto LAB_00157a6c;
}

Assistant:

static TidyMessageImpl *tidyMessageCreateInitV( TidyDocImpl *doc,
                                                Node *node,
                                                uint code,
                                                int line,
                                                int column,
                                                TidyReportLevel level,
                                                va_list args )
{
    TidyMessageImpl *result = TidyDocAlloc(doc, sizeof(TidyMessageImpl));
    TidyDoc tdoc = tidyImplToDoc(doc);
    va_list args_copy;
    enum { sizeMessageBuf=2048 };
    ctmbstr pattern;
    uint i = 0;


    /* Things we know... */

    result->tidyDoc = doc;
    result->tidyNode = node;
    result->code = code;
    result->line = line;
    result->column = column;
    result->level = level;
    /* Is #719 - set 'muted' before any callbacks. */
    result->muted = no;
    i = 0;
    while ((doc->muted.list) && (doc->muted.list[i] != 0))
    {
        if (doc->muted.list[i] == code)
        {
            result->muted = yes;
            break;
        }
        i++;
    }

    /* Things we create... */

    va_copy(args_copy, args);
    result->arguments = BuildArgArray(doc, tidyDefaultString(code), args_copy, &result->argcount);
    va_end(args_copy);

    result->messageKey = TY_(tidyErrorCodeAsKey)(code);

    result->messageFormatDefault = tidyDefaultString(code);
    result->messageFormat = tidyLocalizedString(code);

    result->messageDefault = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->messageDefault, sizeMessageBuf, result->messageFormatDefault, args_copy);
    va_end(args_copy);

    result->message = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->message, sizeMessageBuf, result->messageFormat, args_copy);
    va_end(args_copy);

    result->messagePosDefault = TidyDocAlloc(doc, sizeMessageBuf);
    result->messagePos = TidyDocAlloc(doc, sizeMessageBuf);

    if ( cfgBool(doc, TidyEmacs) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Change formatting to be parsable by GNU Emacs */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
    }
    else if ( cfgBool(doc, TidyShowFilename) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Include filename in output */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
    }
    else
    {
        /* traditional format */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(LINE_COLUMN_STRING), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(LINE_COLUMN_STRING), line, column);
    }

    result->messagePrefixDefault = tidyDefaultString(level);

    result->messagePrefix = tidyLocalizedString(level);

    if ( line > 0 && column > 0 )
        pattern = "%s%s%s";      /* pattern if there's location information */
    else
        pattern = "%.0s%s%s";    /* otherwise if there isn't */

    if ( level > TidyFatal )
        pattern = "%.0s%.0s%s";  /* dialog doesn't have pos or prefix */

    result->messageOutputDefault = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutputDefault, sizeMessageBuf, pattern,
                     result->messagePosDefault, result->messagePrefixDefault,
                     result->messageDefault);

    result->messageOutput = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutput, sizeMessageBuf, pattern,
                     result->messagePos, result->messagePrefix,
                     result->message);

    if ( ( cfgBool(doc, TidyMuteShow) == yes ) && level <= TidyFatal )
    {
        /*\ Issue #655 - Unsafe to use output buffer as one of the va_list
         *  input parameters in some snprintf implmentations.
        \*/
        ctmbstr pc = TY_(tidyErrorCodeAsKey)(code);
        i = TY_(tmbstrlen)(result->messageOutputDefault);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutputDefault + i, sizeMessageBuf - i, " (%s)", pc );
        i = TY_(tmbstrlen)(result->messageOutput);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutput + i, sizeMessageBuf - i, " (%s)", pc );
        i = 0;
    }

    result->allowMessage = yes;

    /* reportFilter is a simple error filter that provides minimal information
       to callback functions, and includes the message buffer in LibTidy's
       configured localization. As it's a "legacy" API, it does not receive
       TidyDialogue messages.*/
    if ( (result->level <= TidyFatal) && doc->reportFilter )
    {
        result->allowMessage = result->allowMessage & doc->reportFilter( tdoc, result->level, result->line, result->column, result->messageOutput );
    }

    /* reportCallback is intended to allow LibTidy users to localize messages
       via their own means by providing a key and the parameters to fill it. 
       As it's a "legacy" API, it does not receive TidyDialogue messages. */
    if ( (result->level <= TidyFatal) && doc->reportCallback )
    {
        TidyDoc tdoc = tidyImplToDoc( doc );
        va_copy(args_copy, args);
        result->allowMessage = result->allowMessage & doc->reportCallback( tdoc, result->level, result->line, result->column, result->messageKey, args_copy );
        va_end(args_copy);
    }

    /* messageCallback is the newest interface to interrogate Tidy's
       emitted messages. */
    if ( doc->messageCallback )
    {
        result->allowMessage = result->allowMessage & doc->messageCallback( tidyImplToMessage(result) );
    }

    return result;
}